

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  lzh_br *br;
  lzh_stream *strm;
  huffman_conflict *hf;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  wchar_t wVar5;
  int64_t *piVar6;
  long *plVar7;
  lzh_dec *ds;
  htree_t *phVar8;
  uchar *puVar9;
  uint64_t uVar10;
  long lVar11;
  long lVar12;
  uint16_t uVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  void *pvVar19;
  undefined4 *puVar20;
  ulong uVar21;
  long lVar22;
  wchar_t wVar23;
  uint uVar24;
  uint uVar25;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  char *fmt;
  int iVar26;
  size_t __size;
  size_t len;
  htree_t *phVar27;
  ulong uVar28;
  void *__src;
  wchar_t *pwVar29;
  wchar_t wVar30;
  wchar_t wVar31;
  byte local_d8;
  byte local_a0;
  lzh_br local_98;
  lzh_br *local_80;
  void **local_78;
  ulong local_70;
  huffman_conflict *local_68;
  wchar_t *local_60;
  wchar_t *local_58;
  uchar *local_50;
  long local_48;
  int *local_40;
  long local_38;
  
  piVar6 = (int64_t *)a->format->data;
  if (piVar6[2] != 0) {
    __archive_read_consume(a,piVar6[2]);
    piVar6[2] = 0;
  }
  if (*(char *)((long)piVar6 + 0x124) != '\0') {
    if (*(char *)((long)piVar6 + 0x125) == '\0') {
      if (((*(byte *)(piVar6 + 8) & 8) != 0) &&
         (*(short *)((long)piVar6 + 0xc2) != (short)piVar6[3])) {
        archive_set_error(&a->archive,-1,"LHa data CRC error");
        return L'\xffffffec';
      }
      *(undefined1 *)((long)piVar6 + 0x125) = 1;
    }
    *offset = *piVar6;
    *size = 0;
    *buff = (void *)0x0;
    return L'\x01';
  }
  plVar7 = (long *)a->format->data;
  if (*(char *)((long)piVar6 + 0x126) == '\0') {
    if (plVar7[1] == 0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = *plVar7;
      *(undefined1 *)((long)plVar7 + 0x124) = 1;
      return L'\0';
    }
    pvVar19 = __archive_read_ahead(a,1,(ssize_t *)&local_98);
    *buff = pvVar19;
    if (0 < (long)local_98.cache_buffer) {
      if (plVar7[1] < (long)local_98.cache_buffer) {
        local_98.cache_buffer = plVar7[1];
      }
      uVar10 = local_98.cache_buffer;
      uVar13 = lha_crc16(*(uint16_t *)(plVar7 + 3),pvVar19,local_98.cache_buffer);
      *(uint16_t *)(plVar7 + 3) = uVar13;
      *size = uVar10;
      lVar22 = *plVar7;
      *offset = lVar22;
      *plVar7 = lVar22 + uVar10;
      plVar1 = plVar7 + 1;
      *plVar1 = *plVar1 - uVar10;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar7 + 0x124) = 1;
      }
      plVar7[2] = uVar10;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
LAB_0012abeb:
    iVar26 = 0x54;
  }
  else {
    if (plVar7[0x25] == 0) {
      plVar7[0x26] = 0x10000;
      pvVar19 = malloc(0x10000);
      plVar7[0x25] = (long)pvVar19;
      if (pvVar19 != (void *)0x0) goto LAB_0012a9bb;
      fmt = "No memory for lzh decompression";
    }
    else {
LAB_0012a9bb:
      if (*(char *)((long)plVar7 + 0x123) != '\0') {
LAB_0012a9c8:
        pvVar19 = __archive_read_ahead(a,1,&local_38);
        plVar7[0x2f] = (long)pvVar19;
        if (0 < local_38) {
          lVar22 = plVar7[1];
          if (lVar22 < local_38) {
            local_38 = lVar22;
          }
          lVar12 = local_38;
          plVar7[0x30] = local_38;
          plVar7[0x31] = 0;
          if (plVar7[0x33] == 0) {
            *(int *)(plVar7 + 0x32) = (int)plVar7[0x25];
            *(undefined4 *)((long)plVar7 + 0x194) = *(undefined4 *)((long)plVar7 + 300);
            *(int *)(plVar7 + 0x33) = (int)plVar7[0x26];
            *(undefined4 *)((long)plVar7 + 0x19c) = *(undefined4 *)((long)plVar7 + 0x134);
          }
          iVar26 = ((int *)plVar7[0x35])[0x55];
          if (iVar26 == 0) {
            strm = (lzh_stream *)(plVar7 + 0x2f);
            local_78 = buff;
            local_40 = (int *)plVar7[0x35];
            do {
              ds = (lzh_dec *)plVar7[0x35];
              br = &ds->br;
              if (*local_40 < 9) {
                hf = &ds->pt;
                local_58 = (ds->pt).freq;
                local_68 = &ds->lt;
                local_60 = (ds->lt).freq;
                wVar18 = ds->state;
switchD_0012aca1_default:
                switch(wVar18) {
                case L'\0':
                  wVar18 = (ds->br).cache_avail;
                  if (wVar18 < L'\x10') {
                    wVar18 = lzh_br_fillup(strm,br);
                    if (wVar18 != L'\0') {
                      wVar18 = (ds->br).cache_avail;
                      goto LAB_0012acc9;
                    }
                    iVar26 = 0;
                    if (lVar12 != lVar22) goto LAB_0012bb6f;
                    if ((ds->br).cache_avail < L'\b') {
                      if ((ds->w_pos < L'\x01') ||
                         (wVar18 = lzh_copy_from_window(strm,ds), iVar26 = 0, wVar18 != L'\0')) {
                        iVar26 = 1;
                      }
                      goto LAB_0012bb6f;
                    }
                  }
                  else {
LAB_0012acc9:
                    wVar18 = wVar18 + L'\xfffffff0';
                    uVar21 = (ds->br).cache_buffer >> ((byte)wVar18 & 0x3f);
                    ds->blocks_avail = (uint)uVar21 & 0xffff;
                    if ((uVar21 & 0xffff) != 0) {
                      (ds->br).cache_avail = wVar18;
                      wVar15 = ds->literal_pt_len_bits;
                      (ds->pt).len_size = ds->literal_pt_len_size;
                      (ds->pt).len_bits = wVar15;
                      ds->reading_position = L'\0';
                      goto LAB_0012ad28;
                    }
                  }
                  break;
                case L'\x01':
                  wVar18 = (ds->br).cache_avail;
                  wVar15 = (ds->pt).len_bits;
LAB_0012ad28:
                  if (wVar15 <= wVar18) {
LAB_0012ad5c:
                    wVar23 = (uint)cache_masks[wVar15] &
                             (uint)((ds->br).cache_buffer >> ((byte)(wVar18 - wVar15) & 0x3f));
                    (ds->pt).len_avail = wVar23;
                    (ds->br).cache_avail = wVar18 - wVar15;
                    goto LAB_0012ad77;
                  }
                  wVar23 = lzh_br_fillup(strm,br);
                  wVar18 = (ds->br).cache_avail;
                  wVar15 = (ds->pt).len_bits;
                  if (wVar15 <= wVar18 || wVar23 != L'\0') goto LAB_0012ad5c;
                  if (lVar12 == lVar22) break;
                  ds->state = L'\x01';
                  goto LAB_0012bb54;
                case L'\x02':
                  wVar23 = (ds->pt).len_avail;
LAB_0012ad77:
                  if (wVar23 == L'\0') {
                    wVar18 = (ds->br).cache_avail;
                    wVar23 = (ds->pt).len_bits;
                    if (wVar18 < wVar23) {
                      wVar15 = lzh_br_fillup(strm,br);
                      wVar18 = (ds->br).cache_avail;
                      wVar23 = (ds->pt).len_bits;
                      if (wVar18 < wVar23 && wVar15 == L'\0') {
                        if (lVar12 != lVar22) {
                          ds->state = L'\x02';
                          goto LAB_0012bb54;
                        }
                        break;
                      }
                    }
                    wVar18 = (uint)(br->cache_buffer >> ((char)wVar18 - (char)wVar23 & 0x3fU)) &
                             (uint)cache_masks[wVar23];
                    if (wVar18 < hf->len_size) {
                      *(ds->pt).tbl = (uint16_t)wVar18;
                      (ds->pt).max_bits = L'\0';
                      (ds->pt).shift_bits = L'\0';
                      (ds->pt).bitlen[(uint)wVar18] = '\0';
                      pwVar29 = &(ds->br).cache_avail;
                      *pwVar29 = *pwVar29 - (ds->pt).len_bits;
                      wVar18 = (uint)(ds->reading_position != L'\0') * 4 + L'\x05';
                      goto LAB_0012b30e;
                    }
                    break;
                  }
                  wVar15 = hf->len_size;
                  if (wVar15 < wVar23) break;
                  ds->loop = L'\0';
                  local_58[0x10] = L'\0';
                  local_58[0xc] = L'\0';
                  local_58[0xd] = L'\0';
                  local_58[0xe] = L'\0';
                  local_58[0xf] = L'\0';
                  local_58[8] = L'\0';
                  local_58[9] = L'\0';
                  local_58[10] = L'\0';
                  local_58[0xb] = L'\0';
                  local_58[4] = L'\0';
                  local_58[5] = L'\0';
                  local_58[6] = L'\0';
                  local_58[7] = L'\0';
                  local_58[0] = L'\0';
                  local_58[1] = L'\0';
                  local_58[2] = L'\0';
                  local_58[3] = L'\0';
                  wVar18 = L'\x04';
                  if ((L'\x02' < wVar23) && (wVar23 = L'\0', wVar15 != ds->pos_pt_len_size))
                  goto LAB_0012ae8f;
                  goto LAB_0012b30e;
                case L'\x03':
                  wVar23 = ds->loop;
LAB_0012ae8f:
                  wVar18 = lzh_read_pt_bitlen(strm,wVar23,L'\x03');
                  ds->loop = wVar18;
                  if (wVar18 < L'\x03') {
                    if ((lVar12 != lVar22) && (L'\xffffffff' < wVar18)) {
LAB_0012bc4d:
                      ds->state = L'\x03';
                      goto LAB_0012bb54;
                    }
                  }
                  else {
                    wVar18 = (ds->br).cache_avail;
                    if (wVar18 < L'\x02') {
                      wVar23 = lzh_br_fillup(strm,br);
                      wVar18 = (ds->br).cache_avail;
                      if (wVar18 < L'\x02' && wVar23 == L'\0') {
                        if (lVar12 != lVar22) goto LAB_0012bc4d;
                        break;
                      }
                    }
                    uVar21 = (ds->br).cache_buffer >> ((byte)(wVar18 + L'\xfffffffe') & 0x3f);
                    uVar24 = (uint)uVar21;
                    uVar25 = uVar24 & 3;
                    (ds->br).cache_avail = wVar18 + L'\xfffffffe';
                    if ((int)uVar25 <= (ds->pt).len_avail + L'\xfffffffd') {
                      if ((uVar21 & 3) == 0) {
                        wVar18 = L'\x03';
                      }
                      else {
                        wVar18 = uVar25 + L'\x03';
                        uVar21 = 0;
                        do {
                          (ds->pt).bitlen[uVar21 + 3] = '\0';
                          uVar21 = uVar21 + 1;
                        } while ((uVar24 & 3) != uVar21);
                      }
                      ds->loop = wVar18;
                      goto LAB_0012af55;
                    }
                  }
                  break;
                case L'\x04':
                  wVar18 = ds->loop;
LAB_0012af55:
                  wVar18 = lzh_read_pt_bitlen(strm,wVar18,(ds->pt).len_avail);
                  ds->loop = wVar18;
                  if (wVar18 < (ds->pt).len_avail) {
                    if ((lVar12 != lVar22) && (L'\xffffffff' < wVar18)) {
                      ds->state = L'\x04';
                      goto LAB_0012bb54;
                    }
                  }
                  else {
                    wVar18 = lzh_make_huffman_table(hf);
                    if (wVar18 != L'\0') {
                      wVar18 = L'\t';
                      if (ds->reading_position != L'\0') goto LAB_0012b30e;
                      goto switchD_0012aca1_caseD_5;
                    }
                  }
                  break;
                case L'\x05':
switchD_0012aca1_caseD_5:
                  wVar23 = (ds->br).cache_avail;
                  wVar15 = (ds->lt).len_bits;
                  if (wVar23 < wVar15) {
                    wVar18 = lzh_br_fillup(strm,br);
                    wVar23 = (ds->br).cache_avail;
                    wVar15 = (ds->lt).len_bits;
                    if (wVar23 < wVar15 && wVar18 == L'\0') {
                      if (lVar12 != lVar22) {
                        ds->state = L'\x05';
                        goto LAB_0012bb54;
                      }
                      break;
                    }
                  }
                  wVar18 = (uint)cache_masks[wVar15] &
                           (uint)((ds->br).cache_buffer >> ((byte)(wVar23 - wVar15) & 0x3f));
                  (ds->lt).len_avail = wVar18;
                  (ds->br).cache_avail = wVar23 - wVar15;
                  goto LAB_0012aff2;
                case L'\x06':
                  wVar18 = (ds->lt).len_avail;
LAB_0012aff2:
                  if (wVar18 != L'\0') {
                    if (wVar18 <= local_68->len_size) {
                      wVar23 = L'\0';
                      ds->loop = L'\0';
                      local_60[0x10] = L'\0';
                      local_60[0xc] = L'\0';
                      local_60[0xd] = L'\0';
                      local_60[0xe] = L'\0';
                      local_60[0xf] = L'\0';
                      local_60[8] = L'\0';
                      local_60[9] = L'\0';
                      local_60[10] = L'\0';
                      local_60[0xb] = L'\0';
                      local_60[4] = L'\0';
                      local_60[5] = L'\0';
                      local_60[6] = L'\0';
                      local_60[7] = L'\0';
                      local_60[0] = L'\0';
                      local_60[1] = L'\0';
                      local_60[2] = L'\0';
                      local_60[3] = L'\0';
LAB_0012b036:
                      wVar15 = wVar23;
                      if (wVar23 < wVar18) {
                        do {
                          wVar18 = (ds->br).cache_avail;
                          wVar23 = (ds->pt).max_bits;
                          if (wVar18 < wVar23) {
                            wVar14 = lzh_br_fillup(strm,br);
                            wVar18 = (ds->br).cache_avail;
                            wVar23 = (ds->pt).max_bits;
                            if (wVar23 <= wVar18 || wVar14 != L'\0') goto LAB_0012b07c;
                            if (lVar12 == lVar22) goto LAB_0012b954;
LAB_0012bb43:
                            ds->loop = wVar15;
                            ds->state = L'\a';
                            goto LAB_0012bb54;
                          }
LAB_0012b07c:
                          uVar24 = (uint)cache_masks[wVar23] &
                                   (uint)((ds->br).cache_buffer >>
                                         ((char)wVar18 - (char)wVar23 & 0x3fU));
                          wVar23 = (ds->pt).shift_bits;
                          uVar4 = (ds->pt).tbl[uVar24 >> ((byte)wVar23 & 0x1f)];
                          wVar30 = (wchar_t)uVar4;
                          wVar14 = (ds->pt).len_avail;
                          if (wVar14 <= (int)(uint)uVar4) {
                            phVar8 = (ds->pt).tree;
                            do {
                              if ((wVar23 < L'\x01') ||
                                 (wVar30 = wVar30 - wVar14, (ds->pt).tree_used <= wVar30))
                              goto LAB_0012b189;
                              wVar23 = wVar23 + L'\xffffffff';
                              phVar27 = (htree_t *)&phVar8[wVar30].right;
                              if ((uVar24 >> (wVar23 & 0x1fU) & 1) != 0) {
                                phVar27 = phVar8 + wVar30;
                              }
                              wVar30 = (wchar_t)phVar27->left;
                            } while (wVar14 <= wVar30);
                          }
                          if ((uint)wVar30 < 3) {
                            if (wVar30 == L'\0') {
LAB_0012b189:
                              puVar9 = (ds->lt).bitlen;
                              (ds->br).cache_avail = wVar18 - (uint)*(ds->pt).bitlen;
                              puVar9[wVar15] = '\0';
                              goto LAB_0012b1a9;
                            }
                            uVar24 = (uint)(wVar30 != L'\x01');
                            uVar21 = (ulong)uVar24 * 5 + 4;
                            bVar3 = (ds->pt).bitlen[(uint)wVar30];
                            uVar25 = (uint)bVar3;
                            if (wVar18 < uVar24 * 5 + (uint)bVar3 + L'\x04') {
                              local_70 = uVar21;
                              wVar18 = lzh_br_fillup(strm,br);
                              puVar9 = (ds->pt).bitlen;
                              uVar21 = local_70;
                              if (wVar18 == L'\0') {
                                wVar18 = (ds->br).cache_avail;
                                bVar3 = puVar9[(uint)wVar30];
                                uVar25 = (uint)bVar3;
                                if (wVar18 < (int)((int)local_70 + (uint)bVar3)) {
                                  buff = local_78;
                                  if (lVar12 != lVar22) goto LAB_0012bb43;
                                  goto LAB_0012b954;
                                }
                              }
                              else {
                                uVar25 = (uint)puVar9[(uint)wVar30];
                                wVar18 = (ds->br).cache_avail;
                              }
                            }
                            buff = local_78;
                            wVar18 = (((uint)(wVar30 == L'\x01') * 5 + -9) - uVar25) + wVar18;
                            uVar25 = (uint)cache_masks[uVar21 & 0xffffffff] &
                                     (uint)((ds->br).cache_buffer >> ((byte)wVar18 & 0x3f));
                            uVar24 = uVar25 + 3;
                            if (wVar30 != L'\x01') {
                              uVar24 = uVar25 + 0x14;
                            }
                            (ds->br).cache_avail = wVar18;
                            wVar23 = uVar24 + wVar15;
                            if ((ds->lt).len_avail < wVar23) goto LAB_0012b954;
                            memset((ds->lt).bitlen + wVar15,0,(ulong)uVar24);
                          }
                          else {
                            (ds->br).cache_avail = wVar18 - (uint)(ds->pt).bitlen[(uint)wVar30];
                            pwVar29 = (ds->lt).freq + (uint)(wVar30 + L'\xfffffffe');
                            *pwVar29 = *pwVar29 + L'\x01';
                            (ds->lt).bitlen[wVar15] = (uchar)(wVar30 + L'\xfffffffe');
LAB_0012b1a9:
                            wVar23 = wVar15 + L'\x01';
                          }
                          wVar18 = (ds->lt).len_avail;
                          wVar15 = wVar23;
                        } while (wVar23 < wVar18);
                      }
                      if ((wVar23 <= wVar18) &&
                         (wVar18 = lzh_make_huffman_table(local_68), wVar18 != L'\0')) {
switchD_0012aca1_caseD_8:
                        wVar18 = ds->pos_pt_len_bits;
                        (ds->pt).len_size = ds->pos_pt_len_size;
                        (ds->pt).len_bits = wVar18;
                        ds->reading_position = L'\x01';
                        wVar18 = L'\x01';
                        goto LAB_0012b30e;
                      }
                    }
                    break;
                  }
                  wVar18 = (ds->br).cache_avail;
                  wVar23 = (ds->lt).len_bits;
                  if (wVar18 < wVar23) {
                    wVar15 = lzh_br_fillup(strm,br);
                    wVar18 = (ds->br).cache_avail;
                    wVar23 = (ds->lt).len_bits;
                    if (wVar18 < wVar23 && wVar15 == L'\0') {
                      if (lVar12 == lVar22) break;
                      ds->state = L'\x06';
LAB_0012bb54:
                      iVar26 = 0;
                      goto LAB_0012bb6f;
                    }
                  }
                  wVar18 = (uint)(br->cache_buffer >> ((char)wVar18 - (char)wVar23 & 0x3fU)) &
                           (uint)cache_masks[wVar23];
                  if (local_68->len_size <= wVar18) break;
                  *(ds->lt).tbl = (uint16_t)wVar18;
                  (ds->lt).max_bits = L'\0';
                  (ds->lt).shift_bits = L'\0';
                  (ds->lt).bitlen[(uint)wVar18] = '\0';
                  pwVar29 = &(ds->br).cache_avail;
                  *pwVar29 = *pwVar29 - (ds->lt).len_bits;
                  wVar18 = L'\b';
LAB_0012b30e:
                  ds->state = wVar18;
                  goto switchD_0012aca1_default;
                case L'\a':
                  wVar18 = (ds->lt).len_avail;
                  wVar23 = ds->loop;
                  goto LAB_0012b036;
                case L'\b':
                  goto switchD_0012aca1_caseD_8;
                case L'\t':
                  goto switchD_0012aca1_caseD_9;
                default:
                  goto switchD_0012aca1_default;
                }
LAB_0012b954:
                ds->error = L'\xffffffe7';
                iVar26 = -0x19;
                break;
              }
              local_98.cache_buffer = (ds->br).cache_buffer;
              local_98.cache_avail = (ds->br).cache_avail;
              local_98._12_4_ = *(undefined4 *)&(ds->br).field_0xc;
              local_68 = (huffman_conflict *)ds->w_buff;
              local_60 = (wchar_t *)(ds->lt).bitlen;
              local_50 = (ds->pt).bitlen;
              local_70 = CONCAT44(local_70._4_4_,ds->blocks_avail);
              wVar18 = ds->copy_len;
              wVar23 = ds->copy_pos;
              wVar15 = ds->w_pos;
              wVar14 = ds->w_mask;
              wVar30 = ds->state;
              wVar5 = ds->w_size;
              local_58 = (wchar_t *)(long)(ds->lt).max_bits;
              local_48 = (long)(ds->pt).max_bits;
              local_80 = br;
              if ((ds->w_remaining < L'\x01') ||
                 (wVar16 = lzh_copy_from_window(strm,ds), wVar16 != L'\0')) {
switchD_0012b3d3_default:
                do {
                  wVar16 = local_98.cache_avail;
                  switch(wVar30) {
                  case L'\t':
                    pwVar29 = local_58;
                    if ((wchar_t)local_70 != 0) {
                      do {
                        if (wVar16 < (wchar_t)pwVar29) {
                          wVar18 = lzh_br_fillup(strm,&local_98);
                          wVar16 = local_98.cache_avail;
                          if ((wVar18 != L'\0') || ((wchar_t)pwVar29 <= local_98.cache_avail))
                          goto LAB_0012b467;
                          if (lVar12 != lVar22) {
                            wVar30 = L'\t';
                            goto LAB_0012b88a;
                          }
                          uVar24 = (uint)cache_masks[(long)pwVar29] &
                                   (uint)(local_98.cache_buffer <<
                                         ((char)pwVar29 - (char)local_98.cache_avail & 0x3fU));
                          wVar18 = (ds->lt).shift_bits;
                          wVar23 = (ds->lt).len_avail;
                          uVar4 = (ds->lt).tbl[uVar24 >> ((byte)wVar18 & 0x1f)];
                          wVar30 = (wchar_t)uVar4;
                          if ((int)(uint)uVar4 < wVar23) {
                            uVar21 = (ulong)uVar4;
                          }
                          else {
                            phVar8 = (ds->lt).tree;
                            do {
                              uVar21 = 0;
                              if ((wVar18 < L'\x01') ||
                                 (wVar30 = wVar30 - wVar23, (ds->lt).tree_used <= wVar30)) break;
                              wVar18 = wVar18 + L'\xffffffff';
                              phVar27 = (htree_t *)&phVar8[wVar30].right;
                              if ((uVar24 >> (wVar18 & 0x1fU) & 1) != 0) {
                                phVar27 = phVar8 + wVar30;
                              }
                              wVar30 = (wchar_t)phVar27->left;
                              uVar21 = (ulong)(uint)wVar30;
                            } while (wVar23 <= wVar30);
                          }
                          uVar24 = (uint)uVar21;
                          wVar16 = local_98.cache_avail - (uint)*(byte *)((long)local_60 + uVar21);
                          local_98.cache_avail = wVar16;
                          if (wVar16 < L'\0') goto LAB_0012b907;
                        }
                        else {
LAB_0012b467:
                          uVar24 = (uint)cache_masks[(long)pwVar29] &
                                   (uint)(local_98.cache_buffer >>
                                         ((char)wVar16 - (char)pwVar29 & 0x3fU));
                          wVar18 = (ds->lt).shift_bits;
                          wVar23 = (ds->lt).len_avail;
                          uVar4 = (ds->lt).tbl[uVar24 >> ((byte)wVar18 & 0x1f)];
                          wVar30 = (wchar_t)uVar4;
                          if ((int)(uint)uVar4 < wVar23) {
                            uVar21 = (ulong)uVar4;
                          }
                          else {
                            phVar8 = (ds->lt).tree;
                            do {
                              uVar21 = 0;
                              if ((wVar18 < L'\x01') ||
                                 (wVar30 = wVar30 - wVar23, (ds->lt).tree_used <= wVar30)) break;
                              wVar18 = wVar18 + L'\xffffffff';
                              phVar27 = (htree_t *)&phVar8[wVar30].right;
                              if ((uVar24 >> (wVar18 & 0x1fU) & 1) != 0) {
                                phVar27 = phVar8 + wVar30;
                              }
                              wVar30 = (wchar_t)phVar27->left;
                              uVar21 = (ulong)(uint)wVar30;
                            } while (wVar23 <= wVar30);
                          }
                          uVar24 = (uint)uVar21;
                          wVar16 = wVar16 - (uint)*(byte *)((long)local_60 + uVar21);
                          local_98.cache_avail = wVar16;
                        }
                        pwVar29 = local_58;
                        local_70 = CONCAT44(local_70._4_4_,(wchar_t)local_70 + -1);
                        if (0xff < uVar24) goto LAB_0012b5b3;
                        *(char *)((long)local_68->freq + (long)wVar15 + -0xc) = (char)uVar24;
                        wVar15 = wVar15 + L'\x01';
                        if (wVar5 <= wVar15) {
                          ds->w_remaining = wVar5;
                          wVar18 = lzh_copy_from_window(strm,ds);
                          wVar15 = L'\0';
                          if (wVar18 == L'\0') {
                            wVar30 = L'\t';
                            goto LAB_0012b88a;
                          }
                        }
                        if ((wchar_t)local_70 == 0) break;
                      } while( true );
                    }
                    ds->state = L'\0';
                    *(undefined4 *)&local_80->cache_buffer = (undefined4)local_98.cache_buffer;
                    *(undefined4 *)((long)&local_80->cache_buffer + 4) = local_98.cache_buffer._4_4_
                    ;
                    local_80->cache_avail = local_98.cache_avail;
                    *(undefined4 *)&local_80->field_0xc = local_98._12_4_;
                    ds->blocks_avail = L'\0';
                    ds->w_pos = wVar15;
                    ds->copy_pos = L'\0';
switchD_0012aca1_caseD_9:
                    iVar26 = 100;
                    goto LAB_0012b8d9;
                  case L'\n':
                    goto LAB_0012b5ba;
                  case L'\v':
                    goto switchD_0012b3d3_caseD_b;
                  case L'\f':
                    goto switchD_0012b3d3_caseD_c;
                  }
                } while( true );
              }
LAB_0012b88a:
              *(undefined4 *)&local_80->cache_buffer = (undefined4)local_98.cache_buffer;
              *(undefined4 *)((long)&local_80->cache_buffer + 4) = local_98.cache_buffer._4_4_;
              local_80->cache_avail = local_98.cache_avail;
              *(undefined4 *)&local_80->field_0xc = local_98._12_4_;
              ds->blocks_avail = (wchar_t)local_70;
              ds->state = wVar30;
              ds->w_pos = wVar15;
              iVar26 = 0;
LAB_0012b8d9:
            } while (iVar26 == 100);
LAB_0012bb6f:
            lVar22 = (lVar12 - plVar7[0x30]) + plVar7[0x31];
            plVar7[0x31] = lVar22;
          }
          else {
            lVar22 = 0;
          }
          if (iVar26 != 0) {
            if (iVar26 != 1) {
              archive_set_error(&a->archive,-1,"Bad lzh data");
              return L'\xffffffe7';
            }
            *(undefined1 *)((long)plVar7 + 0x124) = 1;
          }
          plVar7[2] = lVar22;
          plVar7[1] = plVar7[1] - lVar22;
          if ((plVar7[0x33] != 0) && (*(char *)((long)plVar7 + 0x124) == '\0')) {
            *offset = *plVar7;
            *size = 0;
            *buff = (void *)0x0;
            return L'\0';
          }
          *offset = *plVar7;
          pvVar19 = (void *)plVar7[0x25];
          len = plVar7[0x32] - (long)pvVar19;
          *size = len;
          *buff = pvVar19;
          uVar13 = lha_crc16(*(uint16_t *)(plVar7 + 3),pvVar19,len);
          *(uint16_t *)(plVar7 + 3) = uVar13;
          *plVar7 = *plVar7 + len;
          return L'\0';
        }
        fmt = "Truncated LHa file body";
        goto LAB_0012abeb;
      }
      puVar20 = (undefined4 *)plVar7[0x35];
      local_78 = buff;
      if (puVar20 == (undefined4 *)0x0) {
        puVar20 = (undefined4 *)calloc(1,0x158);
        plVar7[0x35] = (long)puVar20;
        if (puVar20 != (undefined4 *)0x0) goto LAB_0012ab02;
      }
      else {
LAB_0012ab02:
        puVar20[0x55] = 0xffffffe7;
        if ((*(char *)((long)plVar7 + 0x29) != 'l') || (*(char *)((long)plVar7 + 0x2a) != 'h')) {
LAB_0012ab6d:
          *local_78 = (void *)0x0;
          *size = 0;
          *offset = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        cVar2 = *(char *)((long)plVar7 + 0x2b);
        if (cVar2 == '5') {
          local_d8 = 0;
          iVar26 = 0xd;
LAB_0012b998:
          local_a0 = 0;
        }
        else {
          if (cVar2 != '7') {
            if (cVar2 != '6') goto LAB_0012ab6d;
            iVar26 = 0xf;
            local_d8 = 1;
            goto LAB_0012b998;
          }
          iVar26 = 0x10;
          local_a0 = 1;
          local_d8 = 0;
        }
        uVar25 = 1 << (sbyte)iVar26;
        puVar20[0x55] = 0xffffffe2;
        uVar24 = puVar20[1];
        puVar20[1] = uVar25;
        puVar20[2] = uVar25 - 1;
        pvVar19 = *(void **)(puVar20 + 4);
        if (uVar24 == uVar25 && pvVar19 != (void *)0x0) {
          __size = (size_t)uVar24;
        }
        else {
          free(pvVar19);
          __size = (size_t)(int)puVar20[1];
          pvVar19 = malloc(__size);
          *(void **)(puVar20 + 4) = pvVar19;
          if (pvVar19 == (void *)0x0) goto LAB_0012ba83;
        }
        memset(pvVar19,0x20,__size);
        puVar20[6] = 0;
        puVar20[9] = 0;
        *puVar20 = 0;
        puVar20[0x4f] = iVar26 + 1;
        puVar20[0x50] = (local_d8 | local_a0) | 4;
        *(undefined8 *)(puVar20 + 0x51) = 0x500000013;
        *(undefined8 *)(puVar20 + 10) = 0;
        puVar20[0xc] = 0;
        wVar18 = lzh_huffman_init((huffman_conflict *)(puVar20 + 0xe),0x1fe,tbl_bits);
        if (wVar18 == L'\0') {
          puVar20[0x10] = 9;
          wVar18 = lzh_huffman_init((huffman_conflict *)(puVar20 + 0x2e),0x13,tbl_bits_00);
          if (wVar18 == L'\0') {
            puVar20[0x55] = 0;
            *(undefined1 *)((long)plVar7 + 0x123) = 1;
            plVar7[0x33] = 0;
            plVar7[0x34] = 0;
            buff = local_78;
            goto LAB_0012a9c8;
          }
        }
      }
LAB_0012ba83:
      fmt = "Couldn\'t allocate memory for lzh decompression";
    }
    iVar26 = 0xc;
  }
  archive_set_error(&a->archive,iVar26,fmt);
  return L'\xffffffe2';
LAB_0012b5b3:
  wVar18 = uVar24 + L'\xffffff03';
LAB_0012b5ba:
  lVar11 = local_48;
  wVar23 = (wchar_t)local_48;
  cVar2 = (char)local_48;
  if (wVar16 < wVar23) {
    wVar30 = lzh_br_fillup(strm,&local_98);
    wVar16 = local_98.cache_avail;
    if ((wVar30 != L'\0') || (wVar23 <= local_98.cache_avail)) goto LAB_0012b63e;
    if (lVar12 != lVar22) {
      ds->copy_len = wVar18;
      wVar30 = L'\n';
      goto LAB_0012b88a;
    }
    uVar24 = (uint)cache_masks[lVar11] &
             (uint)(local_98.cache_buffer << (cVar2 - (char)local_98.cache_avail & 0x3fU));
    wVar23 = (ds->pt).shift_bits;
    wVar30 = (ds->pt).len_avail;
    uVar4 = (ds->pt).tbl[uVar24 >> ((byte)wVar23 & 0x1f)];
    uVar21 = (ulong)uVar4;
    if (wVar30 <= (int)(uint)uVar4) {
      phVar8 = (ds->pt).tree;
      uVar28 = uVar21;
      do {
        uVar21 = 0;
        if ((wVar23 < L'\x01') ||
           (wVar16 = (int)uVar28 - wVar30, uVar21 = 0, (ds->pt).tree_used <= wVar16)) break;
        wVar23 = wVar23 + L'\xffffffff';
        phVar27 = (htree_t *)&phVar8[wVar16].right;
        if ((uVar24 >> (wVar23 & 0x1fU) & 1) != 0) {
          phVar27 = phVar8 + wVar16;
        }
        uVar21 = (ulong)phVar27->left;
        uVar28 = uVar21;
      } while (wVar30 <= (int)(uint)phVar27->left);
    }
    wVar23 = (wchar_t)uVar21;
    wVar30 = local_98.cache_avail - (uint)local_50[uVar21];
    local_98.cache_avail = wVar30;
    if (wVar30 < L'\0') goto LAB_0012b907;
  }
  else {
LAB_0012b63e:
    uVar24 = (uint)cache_masks[lVar11] &
             (uint)(local_98.cache_buffer >> ((char)wVar16 - cVar2 & 0x3fU));
    wVar23 = (ds->pt).shift_bits;
    wVar30 = (ds->pt).len_avail;
    uVar4 = (ds->pt).tbl[uVar24 >> ((byte)wVar23 & 0x1f)];
    uVar21 = (ulong)uVar4;
    if (wVar30 <= (int)(uint)uVar4) {
      phVar8 = (ds->pt).tree;
      uVar28 = uVar21;
      do {
        uVar21 = 0;
        if ((wVar23 < L'\x01') ||
           (wVar31 = (int)uVar28 - wVar30, uVar21 = 0, (ds->pt).tree_used <= wVar31)) break;
        wVar23 = wVar23 + L'\xffffffff';
        phVar27 = (htree_t *)&phVar8[wVar31].right;
        if ((uVar24 >> (wVar23 & 0x1fU) & 1) != 0) {
          phVar27 = phVar8 + wVar31;
        }
        uVar21 = (ulong)phVar27->left;
        uVar28 = uVar21;
      } while (wVar30 <= (int)(uint)phVar27->left);
    }
    wVar23 = (wchar_t)uVar21;
    local_98.cache_avail = wVar16 - (uint)local_50[uVar21];
  }
switchD_0012b3d3_caseD_b:
  if (L'\x01' < wVar23) {
    wVar30 = wVar23 + L'\xffffffff';
    if (local_98.cache_avail < wVar30) {
      wVar16 = lzh_br_fillup(strm,&local_98);
      if ((wVar16 == L'\0') && (local_98.cache_avail < wVar30)) {
        if (lVar12 != lVar22) {
          ds->copy_len = wVar18;
          ds->copy_pos = wVar23;
          wVar30 = L'\v';
          goto LAB_0012b88a;
        }
LAB_0012b907:
        ds->error = L'\xffffffe7';
        iVar26 = -0x19;
        goto LAB_0012b8d9;
      }
    }
    wVar23 = ((uint)cache_masks[(uint)wVar30] &
             (uint)(local_98.cache_buffer >> ((byte)(local_98.cache_avail - wVar30) & 0x3f))) +
             (1 << ((byte)wVar30 & 0x1f));
    local_98.cache_avail = local_98.cache_avail - wVar30;
  }
  wVar23 = ~wVar23 + wVar15 & wVar14;
switchD_0012b3d3_caseD_c:
  while( true ) {
    wVar30 = wVar15;
    if (wVar15 < wVar23) {
      wVar30 = wVar23;
    }
    wVar30 = wVar5 - wVar30;
    wVar16 = wVar30;
    if (wVar18 < wVar30) {
      wVar16 = wVar18;
    }
    wVar31 = wVar16 + wVar23;
    pvVar19 = (void *)((long)local_68->freq + (long)wVar15 + -0xc);
    __src = (void *)((long)local_68->freq + (long)wVar23 + -0xc);
    if ((wVar31 < wVar15) || (wVar15 + wVar16 < wVar23)) {
      memcpy(pvVar19,__src,(long)wVar16);
    }
    else if (L'\0' < wVar16) {
      uVar21 = 0;
      do {
        *(undefined1 *)((long)pvVar19 + uVar21) = *(undefined1 *)((long)__src + uVar21);
        uVar21 = uVar21 + 1;
      } while ((uint)wVar16 != uVar21);
    }
    wVar15 = wVar15 + wVar16 & wVar14;
    if (wVar15 == L'\0') {
      ds->w_remaining = wVar5;
      wVar17 = lzh_copy_from_window(strm,ds);
      if (wVar17 == L'\0') {
        wVar15 = L'\0';
        buff = local_78;
        if (wVar30 < wVar18) {
          ds->copy_len = wVar18 - wVar16;
          ds->copy_pos = wVar31 & wVar14;
          wVar30 = L'\f';
        }
        else {
          wVar30 = L'\t';
        }
        goto LAB_0012b88a;
      }
    }
    if (wVar18 <= wVar30) break;
    wVar18 = wVar18 - wVar16;
    wVar23 = wVar31 & wVar14;
  }
  wVar30 = L'\t';
  buff = local_78;
  goto switchD_0012b3d3_default;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		if (!lha->end_of_entry_cleanup) {
			if ((lha->setflag & CRC_IS_SET) &&
			    lha->crc != lha->entry_crc_calculated) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "LHa data CRC error");
				return (ARCHIVE_WARN);
			}

			/* End-of-entry cleanup done. */
			lha->end_of_entry_cleanup = 1;
		}
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}